

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O2

bool icu_63::number::impl::AffixUtils::hasCurrencySymbols
               (UnicodeString *affixPattern,UErrorCode *status)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  Field FVar4;
  UErrorCode *in_R8;
  AffixTag AVar5;
  AffixTag tag;
  AffixTag local_38;
  
  AVar5 = local_38;
  sVar1 = (affixPattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (affixPattern->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  if (iVar3 == 0) {
LAB_00256cba:
    bVar2 = false;
  }
  else {
    local_38._0_8_ = local_38._4_8_ << 0x20;
    local_38.type = AVar5.type;
    local_38.state = STATE_BASE;
    AVar5 = local_38;
    do {
      do {
        bVar2 = hasNext(&local_38,affixPattern);
        if (!bVar2) goto LAB_00256cba;
        tag._8_8_ = affixPattern;
        tag.offset = (int)AVar5._8_8_;
        tag.codePoint = (int)((ulong)AVar5._8_8_ >> 0x20);
        AVar5 = nextToken(AVar5._0_8_,tag,(UnicodeString *)status,in_R8);
        if (U_ZERO_ERROR < *status) goto LAB_00256cba;
        local_38 = AVar5;
      } while (-1 < AVar5._8_8_);
      FVar4 = getFieldForType(AVar5.type);
    } while (FVar4 != UNUM_CURRENCY_FIELD);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool AffixUtils::hasCurrencySymbols(const UnicodeString &affixPattern, UErrorCode &status) {
    if (affixPattern.length() == 0) {
        return false;
    }
    AffixTag tag;
    while (hasNext(tag, affixPattern)) {
        tag = nextToken(tag, affixPattern, status);
        if (U_FAILURE(status)) { return false; }
        if (tag.type < 0 && getFieldForType(tag.type) == UNUM_CURRENCY_FIELD) {
            return true;
        }
    }
    return false;
}